

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O1

void __thiscall
vkt::api::anon_unknown_0::CheckIncompleteResult<vk::VkExtensionProperties>::operator()
          (CheckIncompleteResult<vk::VkExtensionProperties> *this,Context *context,
          ResultCollector *results,size_t expectedCompleteSize)

{
  ulong uVar1;
  long lVar2;
  pointer pVVar3;
  pointer pVVar4;
  pointer pVVar5;
  ulong uVar6;
  uint uVar7;
  vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> outputData;
  vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> local_70;
  ResultCollector *local_58;
  string local_50;
  
  if (expectedCompleteSize == 0) {
    return;
  }
  local_58 = results;
  std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::vector
            (&local_70,expectedCompleteSize,(allocator_type *)&local_50);
  pVVar4 = local_70.
           super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pVVar3 = local_70.
           super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (pVVar5 = local_70.
                super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                ._M_impl.super__Vector_impl_data._M_start; pVVar5 < pVVar4; pVVar5 = pVVar5 + 1) {
    memset(pVVar5,0xde,0x104);
  }
  uVar7 = (uint)(expectedCompleteSize / 3);
  this->m_count = uVar7;
  this->m_result = VK_SUCCESS;
  (*this->_vptr_CheckIncompleteResult[2])(this,context,pVVar3);
  if ((this->m_count == uVar7) && (this->m_result == VK_INCOMPLETE)) {
    for (pVVar5 = local_70.
                  super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                  ._M_impl.super__Vector_impl_data._M_start + this->m_count;
        (pVVar5 < local_70.
                  super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                  ._M_impl.super__Vector_impl_data._M_finish && (pVVar5->extensionName[0] == -0x22))
        ; pVVar5 = pVVar5 + 1) {
      uVar6 = 0xffffffffffffffff;
      do {
        if (uVar6 == 0x102) goto LAB_00425be6;
        uVar1 = uVar6 + 1;
        lVar2 = uVar6 + 2;
        uVar6 = uVar1;
      } while (pVVar5->extensionName[lVar2] == -0x22);
      if (uVar1 < 0x103) break;
LAB_00425be6:
    }
    if (pVVar5 >= local_70.
                  super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                  ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00425c3a;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Query didn\'t return VK_INCOMPLETE","");
  tcu::ResultCollector::fail(local_58,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
LAB_00425c3a:
  if (local_70.
      super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.
                    super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.
                          super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.
                          super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void operator() (Context& context, tcu::ResultCollector& results, const std::size_t expectedCompleteSize)
	{
		if (expectedCompleteSize == 0)
			return;

		vector<T>		outputData	(expectedCompleteSize);
		const deUint32	usedSize	= static_cast<deUint32>(expectedCompleteSize / 3);

		ValidateQueryBits::fillBits(outputData.begin(), outputData.end());	// unused entries should have this pattern intact
		m_count		= usedSize;
		m_result	= VK_SUCCESS;

		getResult(context, &outputData[0]);									// update m_count and m_result

		if (m_count != usedSize || m_result != VK_INCOMPLETE || !ValidateQueryBits::checkBits(outputData.begin() + m_count, outputData.end()))
			results.fail("Query didn't return VK_INCOMPLETE");
	}